

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O0

void __thiscall Pl_RunLength::finish(Pl_RunLength *this)

{
  pointer pMVar1;
  Pipeline *pPVar2;
  ulong uVar3;
  runtime_error *this_00;
  undefined1 local_11;
  Pl_RunLength *pPStack_10;
  uchar ch;
  Pl_RunLength *this_local;
  
  pPStack_10 = this;
  pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  if (pMVar1->action == a_encode) {
    flush_encode(this);
    local_11 = 0x80;
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,&local_11,1);
  }
  else {
    if ((anonymous_namespace)::memory_limit != 0) {
      std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
      operator->(&this->m);
      uVar3 = std::__cxx11::string::size();
      if ((anonymous_namespace)::memory_limit < uVar3) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Pl_RunLength memory limit exceeded");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    Pipeline::writeString(pPVar2,&pMVar1->out);
  }
  pPVar2 = Pipeline::next(&this->super_Pipeline);
  (*pPVar2->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_RunLength::finish()
{
    // When decoding, we might have read a length byte not followed by data, which means the stream
    // was terminated early, but we will just ignore this case since this is the only sensible thing
    // to do.
    if (m->action == a_encode) {
        flush_encode();
        unsigned char ch = 128;
        next()->write(&ch, 1);
    } else {
        if (memory_limit && (m->out.size()) > memory_limit) {
            throw std::runtime_error("Pl_RunLength memory limit exceeded");
        }
        next()->writeString(m->out);
    }
    next()->finish();
}